

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_get_device_info__alsa
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    ma_share_mode shareMode,ma_device_info *pDeviceInfo)

{
  ma_allocation_callbacks *pmVar1;
  uint uVar2;
  _func_void_void_ptr_void_ptr *p_Var3;
  ma_result mVar4;
  int iVar5;
  size_t sVar6;
  void *__s;
  void *__s_00;
  int sampleRateDir;
  ma_allocation_callbacks *local_68;
  ma_snd_pcm_t *pPCM;
  ma_context_get_device_info_enum_callback_data__alsa data;
  
  sampleRateDir = 0;
  if (pContext != (ma_context *)0x0) {
    data.foundDevice = 0;
    data.deviceType = deviceType;
    data.pDeviceID = pDeviceID;
    data.shareMode = shareMode;
    data.pDeviceInfo = pDeviceInfo;
    mVar4 = ma_context_enumerate_devices__alsa
                      (pContext,ma_context_get_device_info_enum_callback__alsa,&data);
    if (mVar4 == 0) {
      if (data.foundDevice == 0) {
        mVar4 = -0x68;
      }
      else {
        mVar4 = ma_context_open_pcm__alsa(pContext,shareMode,deviceType,pDeviceID,&pPCM);
        if (mVar4 == 0) {
          sVar6 = (*(pContext->field_21).alsa.snd_pcm_hw_params_sizeof)();
          pmVar1 = &pContext->allocationCallbacks;
          __s = ma__malloc_from_callbacks(sVar6,pmVar1);
          mVar4 = -4;
          if (__s != (void *)0x0) {
            memset(__s,0,sVar6);
            iVar5 = (*(pContext->field_21).alsa.snd_pcm_hw_params_any)(pPCM);
            if (iVar5 < 0) {
              p_Var3 = (pContext->allocationCallbacks).onFree;
              if (p_Var3 != (_func_void_void_ptr_void_ptr *)0x0) {
                (*p_Var3)(__s,pmVar1->pUserData);
              }
              mVar4 = ma_result_from_errno(-iVar5);
              if (pContext->logCallback != (ma_log_proc)0x0) {
                (*pContext->logCallback)
                          (pContext,(ma_device *)0x0,1,
                           "[ALSA] Failed to initialize hardware parameters. snd_pcm_hw_params_any() failed."
                          );
              }
            }
            else {
              (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_min)
                        (__s,&pDeviceInfo->minChannels);
              (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max)
                        (__s,&pDeviceInfo->maxChannels);
              (*(pContext->field_21).alsa.snd_pcm_hw_params_get_rate_min)
                        (__s,&pDeviceInfo->minSampleRate,&sampleRateDir);
              (*(pContext->field_21).alsa.snd_pcm_hw_params_get_rate_max)
                        (__s,&pDeviceInfo->maxSampleRate,&sampleRateDir);
              sVar6 = (*(pContext->field_21).alsa.snd_pcm_format_mask_sizeof)();
              local_68 = pmVar1;
              __s_00 = ma__malloc_from_callbacks(sVar6,pmVar1);
              if (__s_00 == (void *)0x0) {
                p_Var3 = (pContext->allocationCallbacks).onFree;
                if (p_Var3 != (_func_void_void_ptr_void_ptr *)0x0) {
                  (*p_Var3)(__s,local_68->pUserData);
                }
              }
              else {
                memset(__s_00,0,sVar6);
                (*(pContext->field_21).alsa.snd_pcm_hw_params_get_format_mask)(__s,__s_00);
                pDeviceInfo->formatCount = 0;
                iVar5 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,1);
                if (iVar5 != 0) {
                  uVar2 = pDeviceInfo->formatCount;
                  pDeviceInfo->formatCount = uVar2 + 1;
                  pDeviceInfo->formats[uVar2] = ma_format_u8;
                }
                iVar5 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,2);
                pmVar1 = local_68;
                if (iVar5 != 0) {
                  uVar2 = pDeviceInfo->formatCount;
                  pDeviceInfo->formatCount = uVar2 + 1;
                  pDeviceInfo->formats[uVar2] = ma_format_s16;
                }
                iVar5 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,0x20);
                if (iVar5 != 0) {
                  uVar2 = pDeviceInfo->formatCount;
                  pDeviceInfo->formatCount = uVar2 + 1;
                  pDeviceInfo->formats[uVar2] = ma_format_s24;
                }
                iVar5 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,10);
                if (iVar5 != 0) {
                  uVar2 = pDeviceInfo->formatCount;
                  pDeviceInfo->formatCount = uVar2 + 1;
                  pDeviceInfo->formats[uVar2] = ma_format_s32;
                }
                iVar5 = (*(pContext->field_21).alsa.snd_pcm_format_mask_test)(__s_00,0xe);
                if (iVar5 != 0) {
                  uVar2 = pDeviceInfo->formatCount;
                  pDeviceInfo->formatCount = uVar2 + 1;
                  pDeviceInfo->formats[uVar2] = ma_format_f32;
                }
                p_Var3 = (pContext->allocationCallbacks).onFree;
                if (p_Var3 != (_func_void_void_ptr_void_ptr *)0x0) {
                  (*p_Var3)(__s_00,(pContext->allocationCallbacks).pUserData);
                  p_Var3 = (pContext->allocationCallbacks).onFree;
                  if (p_Var3 != (_func_void_void_ptr_void_ptr *)0x0) {
                    (*p_Var3)(__s,pmVar1->pUserData);
                  }
                }
                (*(pContext->field_21).alsa.snd_pcm_close)(pPCM);
                mVar4 = 0;
              }
            }
          }
        }
      }
    }
    return mVar4;
  }
  __assert_fail("pContext != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x420d,
                "ma_result ma_context_get_device_info__alsa(ma_context *, ma_device_type, const ma_device_id *, ma_share_mode, ma_device_info *)"
               );
}

Assistant:

static ma_result ma_context_get_device_info__alsa(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, ma_share_mode shareMode, ma_device_info* pDeviceInfo)
{
    ma_context_get_device_info_enum_callback_data__alsa data;
    ma_result result;
    int resultALSA;
    ma_snd_pcm_t* pPCM;
    ma_snd_pcm_hw_params_t* pHWParams;
    ma_snd_pcm_format_mask_t* pFormatMask;
    int sampleRateDir = 0;

    MA_ASSERT(pContext != NULL);

    /* We just enumerate to find basic information about the device. */
    data.deviceType = deviceType;
    data.pDeviceID = pDeviceID;
    data.shareMode = shareMode;
    data.pDeviceInfo = pDeviceInfo;
    data.foundDevice = MA_FALSE;
    result = ma_context_enumerate_devices__alsa(pContext, ma_context_get_device_info_enum_callback__alsa, &data);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (!data.foundDevice) {
        return MA_NO_DEVICE;
    }

    /* For detailed info we need to open the device. */
    result = ma_context_open_pcm__alsa(pContext, shareMode, deviceType, pDeviceID, &pPCM);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need to initialize a HW parameters object in order to know what formats are supported. */
    pHWParams = (ma_snd_pcm_hw_params_t*)ma__calloc_from_callbacks(((ma_snd_pcm_hw_params_sizeof_proc)pContext->alsa.snd_pcm_hw_params_sizeof)(), &pContext->allocationCallbacks);
    if (pHWParams == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    resultALSA = ((ma_snd_pcm_hw_params_any_proc)pContext->alsa.snd_pcm_hw_params_any)(pPCM, pHWParams);
    if (resultALSA < 0) {
        ma__free_from_callbacks(pHWParams, &pContext->allocationCallbacks);
        return ma_context_post_error(pContext, NULL, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to initialize hardware parameters. snd_pcm_hw_params_any() failed.", ma_result_from_errno(-resultALSA));
    }

    ((ma_snd_pcm_hw_params_get_channels_min_proc)pContext->alsa.snd_pcm_hw_params_get_channels_min)(pHWParams, &pDeviceInfo->minChannels);
    ((ma_snd_pcm_hw_params_get_channels_max_proc)pContext->alsa.snd_pcm_hw_params_get_channels_max)(pHWParams, &pDeviceInfo->maxChannels);
    ((ma_snd_pcm_hw_params_get_rate_min_proc)pContext->alsa.snd_pcm_hw_params_get_rate_min)(pHWParams, &pDeviceInfo->minSampleRate, &sampleRateDir);
    ((ma_snd_pcm_hw_params_get_rate_max_proc)pContext->alsa.snd_pcm_hw_params_get_rate_max)(pHWParams, &pDeviceInfo->maxSampleRate, &sampleRateDir);

    /* Formats. */
    pFormatMask = (ma_snd_pcm_format_mask_t*)ma__calloc_from_callbacks(((ma_snd_pcm_format_mask_sizeof_proc)pContext->alsa.snd_pcm_format_mask_sizeof)(), &pContext->allocationCallbacks);
    if (pFormatMask == NULL) {
        ma__free_from_callbacks(pHWParams, &pContext->allocationCallbacks);
        return MA_OUT_OF_MEMORY;
    }

    ((ma_snd_pcm_hw_params_get_format_mask_proc)pContext->alsa.snd_pcm_hw_params_get_format_mask)(pHWParams, pFormatMask);

    pDeviceInfo->formatCount = 0;
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_U8)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_u8;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_S16_LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_s16;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_S24_3LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_s24;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_S32_LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_s32;
    }
    if (((ma_snd_pcm_format_mask_test_proc)pContext->alsa.snd_pcm_format_mask_test)(pFormatMask, MA_SND_PCM_FORMAT_FLOAT_LE)) {
        pDeviceInfo->formats[pDeviceInfo->formatCount++] = ma_format_f32;
    }

    ma__free_from_callbacks(pFormatMask, &pContext->allocationCallbacks);
    ma__free_from_callbacks(pHWParams, &pContext->allocationCallbacks);

    ((ma_snd_pcm_close_proc)pContext->alsa.snd_pcm_close)(pPCM);
    return MA_SUCCESS;
}